

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.h
# Opt level: O3

void __thiscall
wabt::TypeChecker::PrintStackIfFailed<wabt::Type,wabt::Type,wabt::Type::Enum>
          (TypeChecker *this,Result result,char *desc,Type args,Type args_1,Enum args_2)

{
  pointer pTVar1;
  TypeVector local_48;
  
  if (result.enum_ == Error) {
    pTVar1 = (pointer)operator_new(0xc);
    local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = pTVar1 + 3;
    pTVar1->enum_ = args.enum_;
    pTVar1[1].enum_ = args_1.enum_;
    pTVar1[2].enum_ = args_2;
    local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = pTVar1;
    local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
         super__Vector_impl_data._M_finish;
    PrintStackIfFailed(this,(Result)0x1,desc,&local_48);
    operator_delete(pTVar1);
  }
  return;
}

Assistant:

inline bool Failed(Result result) {
  return result == Result::Error;
}